

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::QWidgetTextControlPrivate(QWidgetTextControlPrivate *this)

{
  QPoint *in_RDI;
  TextInteractionFlag in_stack_ffffffffffffffec;
  
  QObjectPrivate::QObjectPrivate((QObjectPrivate *)in_RDI,QObjectPrivateVersion);
  *in_RDI = (QPoint)&PTR__QWidgetTextControlPrivate_00d1ff58;
  in_RDI[0xf].xp = 0;
  in_RDI[0xf].yp = 0;
  *(undefined1 *)&in_RDI[0x10].xp.m_i = 0;
  *(undefined1 *)((long)&in_RDI[0x10].xp.m_i + 1) = 0;
  QTextCursor::QTextCursor((QTextCursor *)(in_RDI + 0x11));
  *(undefined1 *)&in_RDI[0x12].xp.m_i = 0;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)(in_RDI + 0x13));
  QTextCursor::QTextCursor((QTextCursor *)(in_RDI + 0x15));
  QFlags<Qt::TextInteractionFlag>::QFlags
            ((QFlags<Qt::TextInteractionFlag> *)in_RDI,in_stack_ffffffffffffffec);
  QBasicTimer::QBasicTimer((QBasicTimer *)&in_RDI[0x16].yp);
  QBasicTimer::QBasicTimer((QBasicTimer *)(in_RDI + 0x17));
  QPointF::QPointF((QPointF *)(in_RDI + 0x18));
  *(undefined1 *)&in_RDI[0x1a].xp.m_i = 1;
  *(undefined1 *)((long)&in_RDI[0x1a].xp.m_i + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x1a].xp.m_i + 2) = 0;
  QPoint::QPoint(in_RDI);
  QPointer<QWidget>::QPointer((QPointer<QWidget> *)0x70ed6f);
  in_RDI[0x1e].xp.m_i = 0;
  in_RDI[0x1e].yp.m_i = 0;
  *(undefined1 *)&in_RDI[0x1f].xp.m_i = 0;
  QTextCursor::QTextCursor((QTextCursor *)(in_RDI + 0x20));
  QTextCursor::QTextCursor((QTextCursor *)(in_RDI + 0x21));
  *(undefined1 *)&in_RDI[0x22].xp.m_i = 0;
  *(undefined1 *)((long)&in_RDI[0x22].xp.m_i + 1) = 1;
  in_RDI[0x22].yp.m_i = 0;
  *(undefined1 *)&in_RDI[0x23].xp.m_i = 0;
  QList<QAbstractTextDocumentLayout::Selection>::QList
            ((QList<QAbstractTextDocumentLayout::Selection> *)0x70eddc);
  QPalette::QPalette((QPalette *)(in_RDI + 0x27));
  *(undefined1 *)&in_RDI[0x29].xp.m_i = 0;
  *(undefined1 *)((long)&in_RDI[0x29].xp.m_i + 1) = 1;
  QString::QString((QString *)0x70ee0c);
  QString::QString((QString *)0x70ee1d);
  QTextBlock::QTextBlock((QTextBlock *)(in_RDI + 0x30));
  *(undefined1 *)&in_RDI[0x32].xp.m_i = 0;
  *(undefined1 *)((long)&in_RDI[0x32].xp.m_i + 1) = 0;
  *(undefined1 *)((long)&in_RDI[0x32].xp.m_i + 2) = 0;
  *(undefined1 *)((long)&in_RDI[0x32].xp.m_i + 3) = 0;
  QString::QString((QString *)0x70ee5b);
  return;
}

Assistant:

QWidgetTextControlPrivate::QWidgetTextControlPrivate()
    : doc(nullptr), cursorOn(false), cursorVisible(false), cursorIsFocusIndicator(false),
#ifndef Q_OS_ANDROID
      interactionFlags(Qt::TextEditorInteraction),
#else
      interactionFlags(Qt::TextEditable | Qt::TextSelectableByKeyboard),
#endif
      dragEnabled(true),
#if QT_CONFIG(draganddrop)
      mousePressed(false), mightStartDrag(false),
#endif
      lastSelectionPosition(0), lastSelectionAnchor(0),
      ignoreAutomaticScrollbarAdjustement(false),
      overwriteMode(false),
      acceptRichText(true),
      preeditCursor(0), hideCursor(false),
      hasFocus(false),
#ifdef QT_KEYPAD_NAVIGATION
      hasEditFocus(false),
#endif
      isEnabled(true),
      hadSelectionOnMousePress(false),
      ignoreUnusedNavigationEvents(false),
      openExternalLinks(false),
      wordSelectionEnabled(false)
{}